

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_psk_derive_premaster(mbedtls_ssl_context *ssl,mbedtls_key_exchange_type_t key_ex)

{
  mbedtls_ssl_handshake_params *pmVar1;
  uchar *puVar2;
  size_t local_60;
  size_t zlen;
  size_t sStack_50;
  int ret_1;
  size_t len;
  size_t sStack_40;
  int ret;
  size_t psk_len;
  uchar *psk;
  uchar *end;
  uchar *p;
  mbedtls_ssl_context *pmStack_18;
  mbedtls_key_exchange_type_t key_ex_local;
  mbedtls_ssl_context *ssl_local;
  
  pmVar1 = ssl->handshake;
  end = pmVar1->premaster;
  psk = (uchar *)&pmVar1->resume;
  psk_len = (size_t)ssl->conf->psk;
  sStack_40 = ssl->conf->psk_len;
  if (ssl->handshake->psk != (uchar *)0x0) {
    psk_len = (size_t)ssl->handshake->psk;
    sStack_40 = ssl->handshake->psk_len;
  }
  p._4_4_ = key_ex;
  pmStack_18 = ssl;
  if (key_ex == MBEDTLS_KEY_EXCHANGE_PSK) {
    if ((long)psk - (long)end < 2) {
      return -0x7100;
    }
    *end = (uchar)(sStack_40 >> 8);
    end = pmVar1->premaster + 2;
    pmVar1->premaster[1] = (uchar)sStack_40;
    if ((psk < end) || ((ulong)((long)psk - (long)end) < sStack_40)) {
      return -0x7100;
    }
    memset(end,0,sStack_40);
    end = end + sStack_40;
  }
  else if (key_ex == MBEDTLS_KEY_EXCHANGE_RSA_PSK) {
    *end = '\0';
    pmVar1->premaster[1] = '0';
    end = pmVar1->premaster + 0x32;
  }
  else if (key_ex == MBEDTLS_KEY_EXCHANGE_DHE_PSK) {
    len._4_4_ = mbedtls_dhm_calc_secret
                          (&ssl->handshake->dhm_ctx,pmVar1->premaster + 2,
                           (long)psk - (long)(pmVar1->premaster + 2),&stack0xffffffffffffffb0,
                           (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng)
    ;
    if (len._4_4_ != 0) {
      mbedtls_debug_print_ret
                (pmStack_18,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x479,"mbedtls_dhm_calc_secret",len._4_4_);
      return len._4_4_;
    }
    *end = (uchar)(sStack_50 >> 8);
    end[1] = (uchar)sStack_50;
    end = end + sStack_50 + 2;
    mbedtls_debug_print_mpi
              (pmStack_18,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x480,"DHM: K ",&(pmStack_18->handshake->dhm_ctx).K);
  }
  else {
    if (key_ex != MBEDTLS_KEY_EXCHANGE_ECDHE_PSK) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x49b,"should never happen");
      return -0x6c00;
    }
    zlen._4_4_ = mbedtls_ecdh_calc_secret
                           (&ssl->handshake->ecdh_ctx,&local_60,pmVar1->premaster + 2,
                            (long)psk - (long)(pmVar1->premaster + 2),
                            (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng
                           );
    if (zlen._4_4_ != 0) {
      mbedtls_debug_print_ret
                (pmStack_18,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x48e,"mbedtls_ecdh_calc_secret",zlen._4_4_);
      return zlen._4_4_;
    }
    *end = (uchar)(local_60 >> 8);
    end[1] = (uchar)local_60;
    end = end + local_60 + 2;
    mbedtls_debug_print_mpi
              (pmStack_18,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x496,"ECDH: z",&(pmStack_18->handshake->ecdh_ctx).z);
  }
  if ((long)psk - (long)end < 2) {
    ssl_local._4_4_ = -0x7100;
  }
  else {
    puVar2 = end + 1;
    *end = (uchar)(sStack_40 >> 8);
    end = end + 2;
    *puVar2 = (uchar)sStack_40;
    if ((psk < end) || ((ulong)((long)psk - (long)end) < sStack_40)) {
      ssl_local._4_4_ = -0x7100;
    }
    else {
      memcpy(end,(void *)psk_len,sStack_40);
      pmStack_18->handshake->pmslen =
           (size_t)(end + (sStack_40 - (long)pmStack_18->handshake->premaster));
      ssl_local._4_4_ = 0;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_psk_derive_premaster( mbedtls_ssl_context *ssl, mbedtls_key_exchange_type_t key_ex )
{
    unsigned char *p = ssl->handshake->premaster;
    unsigned char *end = p + sizeof( ssl->handshake->premaster );
    const unsigned char *psk = ssl->conf->psk;
    size_t psk_len = ssl->conf->psk_len;

    /* If the psk callback was called, use its result */
    if( ssl->handshake->psk != NULL )
    {
        psk = ssl->handshake->psk;
        psk_len = ssl->handshake->psk_len;
    }

    /*
     * PMS = struct {
     *     opaque other_secret<0..2^16-1>;
     *     opaque psk<0..2^16-1>;
     * };
     * with "other_secret" depending on the particular key exchange
     */
#if defined(MBEDTLS_KEY_EXCHANGE_PSK_ENABLED)
    if( key_ex == MBEDTLS_KEY_EXCHANGE_PSK )
    {
        if( end - p < 2 )
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

        *(p++) = (unsigned char)( psk_len >> 8 );
        *(p++) = (unsigned char)( psk_len      );

        if( end < p || (size_t)( end - p ) < psk_len )
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

        memset( p, 0, psk_len );
        p += psk_len;
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED)
    if( key_ex == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
    {
        /*
         * other_secret already set by the ClientKeyExchange message,
         * and is 48 bytes long
         */
        *p++ = 0;
        *p++ = 48;
        p += 48;
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED)
    if( key_ex == MBEDTLS_KEY_EXCHANGE_DHE_PSK )
    {
        int ret;
        size_t len;

        /* Write length only when we know the actual value */
        if( ( ret = mbedtls_dhm_calc_secret( &ssl->handshake->dhm_ctx,
                                      p + 2, end - ( p + 2 ), &len,
                                      ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_dhm_calc_secret", ret );
            return( ret );
        }
        *(p++) = (unsigned char)( len >> 8 );
        *(p++) = (unsigned char)( len );
        p += len;

        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: K ", &ssl->handshake->dhm_ctx.K  );
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED)
    if( key_ex == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        int ret;
        size_t zlen;

        if( ( ret = mbedtls_ecdh_calc_secret( &ssl->handshake->ecdh_ctx, &zlen,
                                       p + 2, end - ( p + 2 ),
                                       ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecdh_calc_secret", ret );
            return( ret );
        }

        *(p++) = (unsigned char)( zlen >> 8 );
        *(p++) = (unsigned char)( zlen      );
        p += zlen;

        MBEDTLS_SSL_DEBUG_MPI( 3, "ECDH: z", &ssl->handshake->ecdh_ctx.z );
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    /* opaque psk<0..2^16-1>; */
    if( end - p < 2 )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    *(p++) = (unsigned char)( psk_len >> 8 );
    *(p++) = (unsigned char)( psk_len      );

    if( end < p || (size_t)( end - p ) < psk_len )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    memcpy( p, psk, psk_len );
    p += psk_len;

    ssl->handshake->pmslen = p - ssl->handshake->premaster;

    return( 0 );
}